

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void p2a(void *vp,char *d)

{
  int local_24;
  int n;
  int i;
  anon_union_8_2_7f9ed1a6 v;
  char *d_local;
  void *vp_local;
  
  d_local = (char *)vp;
  v.vp = d;
  _n = vp;
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    i2x(*(uchar *)((long)&n + (long)local_24),(char *)((long)v.vp + (long)(local_24 << 1)));
  }
  *(undefined1 *)((long)v.vp + (long)(local_24 << 1)) = 0;
  return;
}

Assistant:

static void p2a(void *vp, char *d) {
  union { void *vp; unsigned char s[sizeof(void*)]; } v;
  v.vp = vp;
  int i=0, n=sizeof(void*);
  for (i=0; i<n; i++) {
    i2x(v.s[i], d+i*2);
  }
  d[2*i] = 0;
}